

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::setup_transposeLP(HModel *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  double dVar2;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer piVar13;
  pointer piVar14;
  pointer piVar15;
  pointer piVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  pointer pdVar23;
  pointer pdVar24;
  pointer pdVar25;
  pointer pdVar26;
  pointer pdVar27;
  pointer pdVar28;
  bool bVar29;
  bool bVar30;
  int iVar31;
  ulong uVar32;
  size_type __n;
  long lVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  bool bVar37;
  double dVar38;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type local_149;
  vector<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_128;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  if (this->intOption[1] == 0) {
    return;
  }
  uVar1 = this->numCol;
  uVar3 = this->numRow;
  if (0.2 < (double)(int)uVar1 / (double)(int)uVar3) {
    return;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)(int)uVar1,(allocator_type *)&local_88);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_88,(long)this->numCol,(allocator_type *)&local_a8);
  iVar31 = this->numCol;
  if (0 < (long)iVar31) {
    pdVar5 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar33 = 0;
    bVar30 = false;
    do {
      dVar38 = pdVar6[lVar33];
      dVar2 = pdVar7[lVar33];
      if ((((dVar38 != -1e+200) || (NAN(dVar38))) || (dVar2 != 1e+200)) || (NAN(dVar2))) {
        if (((dVar38 == 0.0) && (!NAN(dVar38))) && ((dVar2 == 1e+200 && (!NAN(dVar2))))) {
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = -1e+200;
          goto LAB_0012ba7e;
        }
        if (((dVar38 == -1e+200) && (!NAN(dVar38))) && ((dVar2 == 0.0 && (!NAN(dVar2))))) {
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = pdVar5[lVar33];
LAB_0012bae0:
          dVar38 = 1e+200;
          goto LAB_0012ba84;
        }
        bVar29 = true;
        bVar37 = true;
        if ((((dVar38 == 0.0) && (!NAN(dVar38))) && (dVar2 == 0.0)) && (!NAN(dVar2))) {
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = -1e+200;
          goto LAB_0012bae0;
        }
      }
      else {
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar33] = pdVar5[lVar33];
LAB_0012ba7e:
        dVar38 = pdVar5[lVar33];
LAB_0012ba84:
        local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar33] = dVar38;
        bVar37 = false;
        bVar29 = bVar30;
      }
    } while ((!bVar37) &&
            (bVar37 = (long)iVar31 + -1 != lVar33, lVar33 = lVar33 + 1, bVar30 = bVar29, bVar37));
    if (bVar29) goto LAB_0012c021;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_a8,(long)this->numRow,(allocator_type *)&local_c8);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,(long)this->numRow,(allocator_type *)&local_e8);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_e8,(long)this->numRow,(allocator_type *)&local_48);
  __n = (size_type)this->numRow;
  if ((long)__n < 1) {
LAB_0012bc52:
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,__n,(value_type *)&local_128,(allocator_type *)&local_148);
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_128,(long)this->numRow + 1,(value_type *)&local_148,
               (allocator_type *)&local_108);
    uVar36 = (uint)((ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_148,(long)(int)uVar36,(allocator_type *)&local_108);
    std::vector<double,_std::allocator<double>_>::vector(&local_108,(long)(int)uVar36,&local_149);
    if (0 < (int)uVar36) {
      piVar8 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar32 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[piVar8[uVar32]] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[piVar8[uVar32]] + 1;
        uVar32 = uVar32 + 1;
      } while ((uVar36 & 0x7fffffff) != uVar32);
    }
    if (0 < this->numRow) {
      iVar31 = *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar33 = 0;
      do {
        iVar31 = iVar31 + local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar33];
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar33 + 1] = iVar31;
        lVar33 = lVar33 + 1;
      } while (lVar33 < this->numRow);
    }
    if (0 < this->numRow) {
      lVar33 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar33] =
             local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar33];
        lVar33 = lVar33 + 1;
      } while (lVar33 < this->numRow);
    }
    iVar31 = this->numCol;
    if (0 < iVar31) {
      piVar8 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar33 = 0;
      do {
        lVar35 = (long)piVar8[lVar33];
        lVar34 = lVar33 + 1;
        if (piVar8[lVar33] < piVar8[lVar33 + 1]) {
          do {
            iVar31 = piVar9[lVar35];
            iVar4 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar31];
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar31] = iVar4 + 1;
            local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar4] = (int)lVar33;
            local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = pdVar5[lVar35];
            lVar35 = lVar35 + 1;
          } while (lVar35 < piVar8[lVar34]);
        }
        iVar31 = this->numCol;
        lVar33 = lVar34;
      } while (lVar34 < iVar31);
    }
    iVar4 = this->numRow;
    this->numRow = iVar31;
    this->numCol = iVar4;
    piVar8 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    piVar13 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar14 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    piVar9 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    piVar15 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar16 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar17 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar18 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar6 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar19 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar20 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar21 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar22 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar10 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar23 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar24 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar11 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar25 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar26 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar12 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar27 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar28 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = piVar15;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar16;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar9;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = piVar13;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar14;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar8;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar17;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar18;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar5;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar27;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar28;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar12;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar21;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar22;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar7;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar19;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar20;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar6;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar25;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar26;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar11;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar23;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar24;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar10;
    mlFg_Update(this,this->mlFg_action_TransposeLP);
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    pdVar5 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar33 = 0;
    bVar30 = false;
    do {
      dVar38 = pdVar5[lVar33];
      dVar2 = pdVar6[lVar33];
      if ((dVar38 != dVar2) || (NAN(dVar38) || NAN(dVar2))) {
        if (((dVar38 == -1e+200) && (!NAN(dVar38))) && ((dVar2 != 1e+200 || (NAN(dVar2))))) {
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = -1e+200;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = 0.0;
          dVar38 = -dVar2;
          goto LAB_0012bbe5;
        }
        if ((((dVar38 != -1e+200) || (NAN(dVar38))) && (dVar2 == 1e+200)) && (!NAN(dVar2))) {
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = 0.0;
          goto LAB_0012bbb7;
        }
        bVar29 = true;
        bVar37 = true;
        if (((dVar38 == -1e+200) && (!NAN(dVar38))) && ((dVar2 == 1e+200 && (!NAN(dVar2))))) {
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = 0.0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = 0.0;
          dVar38 = 0.0;
          goto LAB_0012bbe5;
        }
      }
      else {
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar33] = -1e+200;
LAB_0012bbb7:
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar33] = 1e+200;
        dVar38 = -dVar38;
LAB_0012bbe5:
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar33] = dVar38;
        bVar37 = false;
        bVar29 = bVar30;
      }
    } while ((!bVar37) && (bVar37 = __n - 1 != lVar33, lVar33 = lVar33 + 1, bVar30 = bVar29, bVar37)
            );
    if (!bVar29) goto LAB_0012bc52;
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0012c021:
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HModel::setup_transposeLP() {
    if (intOption[INTOPT_TRANSPOSE_FLAG] == 0)
        return;

    int transposeCancelled = 0;
    if (1.0 * numCol / numRow > 0.2) {
//        cout << "transpose-cancelled-by-ratio" << endl;
        transposeCancelled = 1;
        return;
    }

    // Convert primal cost to dual bound
    const double inf = HSOL_CONST_INF;
    vector<double> dualRowLower(numCol);
    vector<double> dualRowUpper(numCol);
    for (int j = 0; j < numCol; j++) {
        double lower = colLower[j];
        double upper = colUpper[j];

        /*
         * Primal      Dual
         * Free        row = c
         * x > 0       row < c
         * x < 0       row > c
         * x = 0       row free
         * other       cancel
         */

        if (lower == -inf && upper == inf) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = colCost[j];
        } else if (lower == 0 && upper == inf) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = colCost[j];
        } else if (lower == -inf && upper == 0) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = +inf;
        } else if (lower == 0 && upper == 0) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = +inf;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-column" << endl;
        return;
    }

    // Convert primal row bound to dual variable cost
    vector<double> dualColLower(numRow);
    vector<double> dualColUpper(numRow);
    vector<double> dualCost(numRow);
    for (int i = 0; i < numRow; i++) {
        double lower = rowLower[i];
        double upper = rowUpper[i];

        /*
         * Primal      Dual
         * row = b     Free
         * row < b     y < 0
         * row > b     y > 0
         * row free    y = 0
         * other       cancel
         */

        if (lower == upper) {
            dualColLower[i] = -inf;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper != inf) {
            dualColLower[i] = -inf;
            dualColUpper[i] = 0;
            dualCost[i] = -upper;
        } else if (lower != -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = 0;
            dualCost[i] = 0;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-row" << endl;
        return;
    }

    // We can now really transpose things
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Transpose the problem!
    swap(numRow, numCol);
    Astart.swap(ARstart);
    Aindex.swap(ARindex);
    Avalue.swap(ARvalue);
    colLower.swap(dualColLower);
    colUpper.swap(dualColUpper);
    rowLower.swap(dualRowLower);
    rowUpper.swap(dualRowUpper);
    colCost.swap(dualCost);
//    cout << "problem-transposed" << endl;
    //Deduce the consequences of transposing the LP
    mlFg_Update(mlFg_action_TransposeLP);
}